

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_transaction.cpp
# Opt level: O3

ErrorData * __thiscall
duckdb::MetaTransaction::Commit(ErrorData *__return_storage_ptr__,MetaTransaction *this)

{
  AttachedDatabase *this_00;
  _Hash_node_base *p_Var1;
  undefined1 auVar2 [8];
  reference pvVar3;
  __node_base_ptr p_Var4;
  TransactionManager *pTVar5;
  InternalException *this_01;
  __hash_code __code;
  long lVar6;
  size_type __n;
  undefined1 local_b0 [8];
  undefined1 *local_a8;
  undefined1 local_a0 [24];
  optional_ptr<duckdb::CatalogSet,_true> local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  ErrorData::ErrorData(__return_storage_ptr__);
  lVar6 = (long)(this->all_transactions).
                super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->all_transactions).
                super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar6 != 0) {
    __n = lVar6 >> 3;
    do {
      __n = __n - 1;
      pvVar3 = vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::operator[]
                         (&this->all_transactions,__n);
      this_00 = pvVar3->_M_data;
      local_b0 = (undefined1  [8])this_00;
      p_Var4 = ::std::
               _Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,_std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         (&(this->transactions)._M_h,
                          (ulong)this_00 % (this->transactions)._M_h._M_bucket_count,
                          (key_type *)local_b0,(__hash_code)this_00);
      if ((p_Var4 == (__node_base_ptr)0x0) ||
         (p_Var1 = p_Var4->_M_nxt, p_Var1 == (_Hash_node_base *)0x0)) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        local_b0 = (undefined1  [8])local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b0,
                   "Could not find transaction corresponding to database in MetaTransaction","");
        InternalException::InternalException(this_01,(string *)local_b0);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pTVar5 = AttachedDatabase::GetTransactionManager(this_00);
      if (__return_storage_ptr__->initialized == false) {
        (*pTVar5->_vptr_TransactionManager[3])(local_b0,pTVar5,this->context);
        auVar2 = local_b0;
        __return_storage_ptr__->initialized = (bool)local_b0[0];
        __return_storage_ptr__->type = local_b0[1];
        local_b0 = auVar2;
        ::std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->raw_message,(string *)&local_a8);
        ::std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->final_message,(string *)&local_88);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&__return_storage_ptr__->extra_info,local_68);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_68);
        if (local_88.ptr != (CatalogSet *)&stack0xffffffffffffff88) {
          operator_delete(local_88.ptr);
        }
        if (local_a8 != local_a0 + 8) {
          operator_delete(local_a8);
        }
      }
      else {
        (*pTVar5->_vptr_TransactionManager[4])(pTVar5,p_Var1[2]._M_nxt);
      }
    } while (__n != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorData MetaTransaction::Commit() {
	ErrorData error;
#ifdef DEBUG
	reference_set_t<AttachedDatabase> committed_tx;
#endif
	// commit transactions in reverse order
	for (idx_t i = all_transactions.size(); i > 0; i--) {
		auto &db = all_transactions[i - 1].get();
		auto entry = transactions.find(db);
		if (entry == transactions.end()) {
			throw InternalException("Could not find transaction corresponding to database in MetaTransaction");
		}
#ifdef DEBUG
		auto already_committed = committed_tx.insert(db).second == false;
		if (already_committed) {
			throw InternalException("All databases inside all_transactions should be unique, invariant broken!");
		}
#endif
		auto &transaction_manager = db.GetTransactionManager();
		auto &transaction = entry->second.get();
		if (!error.HasError()) {
			// commit
			error = transaction_manager.CommitTransaction(context, transaction);
		} else {
			// we have encountered an error previously - roll back subsequent entries
			transaction_manager.RollbackTransaction(transaction);
		}
	}
	return error;
}